

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gchtfind.c
# Opt level: O3

LispPTR htfind(LispPTR ptr,int casep)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  LispPTR *pLVar4;
  uint uVar5;
  uint *puVar6;
  uint *puVar7;
  bool bVar8;
  
  uVar2 = ptr >> 0xf & 0x1ffe;
  puVar1 = (uint *)((long)HTmain + (ulong)(ptr & 0xfffe) * 2);
  uVar5 = *puVar1;
  if (uVar5 == 0) {
    if (casep == 1) {
      *puVar1 = uVar2;
LAB_00123fba:
      uVar5 = *Reclaim_cnt_word - 1;
      *Reclaim_cnt_word = uVar5;
      goto LAB_00123fca;
    }
    if (casep != 0) {
LAB_00123faa:
      error("GC error: new entry touches stack bit");
      return 0;
    }
    *puVar1 = uVar2 | 0x40000;
  }
  else {
    if ((uVar5 & 1) != 0) {
      puVar6 = HTcoll + (uVar5 - 1);
      uVar5 = *puVar6;
      if (uVar2 == (uVar5 & 0x1ffe)) {
        puVar7 = (uint *)0x0;
      }
      else {
        do {
          puVar7 = puVar6;
          if ((ulong)puVar7[1] == 0) {
            uVar3 = (ulong)*HTcoll;
            if (uVar3 == 0) {
              uVar3 = (ulong)HTcoll[1];
              if (0x7ffef < uVar3) goto LAB_00123ed7;
              HTcoll[1] = HTcoll[1] + 2;
            }
            else {
              *HTcoll = HTcoll[uVar3 + 1];
            }
            pLVar4 = HTcoll + uVar3;
            pLVar4[1] = *puVar1 - 1;
            *puVar1 = (int)((ulong)((long)pLVar4 - (long)HTcoll) >> 2) + 1;
            if (casep == 1) {
              *pLVar4 = uVar2;
              goto LAB_00123fba;
            }
            if (casep != 0) goto LAB_00123faa;
            *pLVar4 = uVar2 | 0x40000;
            goto LAB_00123f96;
          }
          puVar6 = HTcoll + puVar7[1];
          uVar5 = *puVar6;
        } while (uVar2 != (uVar5 & 0x1ffe));
      }
      if (0xfffdffff < uVar5) {
LAB_00123d69:
        modify_big_reference_count(puVar6,(DLword)casep,ptr);
        return 0;
      }
      if (casep == 1) {
        if (uVar5 < 0x20000) {
          error("attempt to decrement 0 reference count");
        }
        uVar5 = uVar5 - 0x20000;
      }
      else {
        if (casep != 0) {
          error("GC error: mod entry touches stack bit");
          goto LAB_00123f58;
        }
        uVar2 = uVar5 + 0x20000;
        bVar8 = 0xfffbffff < uVar5;
        uVar5 = uVar2;
        if (bVar8) {
          *puVar6 = uVar2;
LAB_00123de7:
          enter_big_reference_count(ptr);
          return 0;
        }
      }
      if ((uVar5 & 0xffff0000) == 0x20000) {
        *Reclaim_cnt_word = *Reclaim_cnt_word + 1;
        if (puVar7 == (uint *)0x0) {
          *puVar1 = puVar6[1] | 1;
        }
        else {
          puVar7[1] = puVar6[1];
        }
        *puVar6 = 0;
        puVar6[1] = *HTcoll;
        *HTcoll = (LispPTR)((ulong)((long)puVar6 - (long)HTcoll) >> 2);
        if (HTcoll[*puVar1] != 0) {
          return 0;
        }
        pLVar4 = HTcoll + *puVar1;
        *puVar1 = pLVar4[-1];
        pLVar4[-1] = 0;
        *pLVar4 = *HTcoll;
        *HTcoll = (LispPTR)((ulong)((long)pLVar4 + (-4 - (long)HTcoll)) >> 2);
        return 0;
      }
LAB_00123f58:
      *puVar6 = uVar5;
      return 0;
    }
    if (uVar2 == (uVar5 & 0x1ffe)) {
      puVar6 = puVar1;
      if (0xfffdffff < uVar5) goto LAB_00123d69;
      if (casep == 1) {
        if (uVar5 < 0x20000) {
          error("attempt to decrement 0 reference count");
        }
        uVar5 = uVar5 - 0x20000;
      }
      else {
        if (casep != 0) {
          error("GC error: mod entry touches stack bit");
          goto LAB_00124010;
        }
        uVar2 = uVar5 + 0x20000;
        bVar8 = 0xfffbffff < uVar5;
        uVar5 = uVar2;
        if (bVar8) {
          *puVar1 = uVar2;
          goto LAB_00123de7;
        }
      }
      if ((uVar5 & 0xffff0000) == 0x20000) {
        *Reclaim_cnt_word = *Reclaim_cnt_word + 1;
        *puVar1 = 0;
        return 0;
      }
LAB_00124010:
      *puVar1 = uVar5;
      return 0;
    }
    uVar3 = (ulong)*HTcoll;
    if (uVar3 == 0) {
      uVar3 = (ulong)HTcoll[1];
      if (0x7ffef < uVar3) goto LAB_00123ed7;
      HTcoll[1] = HTcoll[1] + 2;
    }
    else {
      *HTcoll = HTcoll[uVar3 + 1];
    }
    pLVar4 = HTcoll + uVar3;
    uVar3 = (ulong)*HTcoll;
    if (uVar3 == 0) {
      uVar3 = (ulong)HTcoll[1];
      if (0x7ffef < uVar3) {
LAB_00123ed7:
        disablegc1(0);
        return 0;
      }
      HTcoll[1] = HTcoll[1] + 2;
    }
    else {
      *HTcoll = HTcoll[uVar3 + 1];
    }
    puVar6 = HTcoll + uVar3;
    puVar6[1] = 0;
    *puVar6 = uVar5;
    pLVar4[1] = (LispPTR)((ulong)((long)puVar6 - (long)HTcoll) >> 2);
    *puVar1 = (int)((ulong)((long)pLVar4 - (long)HTcoll) >> 2) + 1;
    if (casep == 1) {
      *pLVar4 = uVar2;
      goto LAB_00123fba;
    }
    if (casep != 0) goto LAB_00123faa;
    *pLVar4 = uVar2 | 0x40000;
  }
LAB_00123f96:
  uVar5 = *Reclaim_cnt_word - 1;
  *Reclaim_cnt_word = uVar5;
  ptr = 0;
LAB_00123fca:
  if (uVar5 < 0xe0001) {
    MachineState.irqcheck = 0;
    MachineState.irqend = 0;
    *Reclaim_cnt_word = 0xe0000;
    return ptr;
  }
  return ptr;
}

Assistant:

LispPTR htfind(LispPTR ptr, int casep) {
  GCENTRY *entry, *link, *prev;
  GCENTRY entry_contents, hiptr;

  /* if the NOREF bit is on in the type table entry, do
  not reference count this pointer. Used for non-reference
  counted types like symbols, and also when the GC is
  disabled. */

  /*
   * Following two tests were moved into GCLOOKUP macro
   * for efficiency.
   */
  /*
      if (GetTypeEntry(ptr) & TT_NOREF) return NIL;
  */
  /* if *GcDisabled_word is T then do nothing */
  /* FS:  this test should not be needed (because type table should
          be cleared).  Also, this test seems to cause an infinite
          ucode loop in remimplicitkeyhash on the 386i		*/

  /*    if(*GcDisabled_word == ATOM_T) return(NIL); */

  /* GC hash table entries have the high 8 bits of the
  pointer stored in the middle. Set up hiptr to have
  the high bits of the pointer ready to store or test
  against */

  hiptr = (((UNSIGNED)ptr) >> (16 - HTHISHIFT)) & HTHIMASK;

  /* entry points at the place in the main hash table
  where this pointer is stored. The 'hash' isn't one really;
  it just uses the low bits of the pointer. */

  entry = HTmain + (LOLOC(ptr) >> 1);

  entry_contents = GETGC(entry);

  if (entry_contents == 0) NewEntry(entry, hiptr, casep, ptr);
  /* NewEntry returns */

  if (entry_contents & 1) { /* low bit means a collision entry */
    /* entry_contents-1 removes low bit */
    link = HTcoll + (entry_contents - 1);
    prev = 0;
    goto newlink;
  }

  if (hiptr == (entry_contents & HTHIMASK)) {
    ModEntry(entry, entry_contents, ptr, casep, delentry);
    /* ModEntry returns or will go to delentry */
  }

  /* new collision */

  GetLink(link);
  GetLink(prev);
  GETGC((GCENTRY *)prev + 1) = 0;
  GETGC((GCENTRY *)prev) = entry_contents;
  GETGC((GCENTRY *)link + 1) = prev - HTcoll;
  GETGC((GCENTRY *)entry) = (link - HTcoll) + 1;

  NewEntry(link, hiptr, casep, ptr);
/* NewEntry returns */

delentry:
  GETGC(entry) = 0;
  return NIL;

/* start here when a collision is detected. link is a pointer to
  the entry in the collision table, prev is the previous collision
  entry or 0 if this is the first one. */

newlink:
  entry_contents = GETGC(link);
  if (hiptr == (entry_contents & HTHIMASK)) {
    ModEntry(link, entry_contents, ptr, casep, dellink);
    /* ModEntry returns or goes to dellink */
  }

  /* collision didn't match  */
  entry_contents = GETGC((GCENTRY *)link + 1);
  if (entry_contents == 0) goto nolink;

  /* try the next link in the collision table */
  prev = link;
  link = HTcoll + entry_contents;
  goto newlink;

dellink:
  if (prev)
    GETGC((GCENTRY *)prev + 1) = GETGC((GCENTRY *)link + 1);
  else
    GETGC((GCENTRY *)entry) = (GETGC((GCENTRY *)link + 1)) | 1;
  FreeLink(link);
  link = HTcoll + (GETGC((GCENTRY *)entry)) - 1;
  if (GETGC(link + 1) == 0) {
    GETGC((GCENTRY *)entry) = GETGC((GCENTRY *)link);
    FreeLink(link);
  }
  return NIL;

nolink: /* no match */

  GetLink(link);
  GETGC((GCENTRY *)link + 1) = GETGC((GCENTRY *)entry) - 1;
  GETGC((GCENTRY *)entry) = (link - HTcoll) + 1;
  NewEntry(link, hiptr, casep, ptr);
  /* NewEntry will return */
}